

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>::
make_root(btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
          *this)

{
  bool bVar1;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
  *pbVar2;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
  *this_local;
  
  pbVar2 = parent(this);
  bVar1 = is_root(pbVar2);
  if (!bVar1) {
    __assert_fail("parent()->is_root()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x4ad,
                  "void phmap::priv::btree_node<phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>>::make_root() [Params = phmap::priv::set_params<long, phmap::Less<long>, std::allocator<long>, 256, true>]"
                 );
  }
  pbVar2 = parent(this);
  pbVar2 = parent(pbVar2);
  set_parent(this,pbVar2);
  return;
}

Assistant:

void make_root() {
            assert(parent()->is_root());
            set_parent(parent()->parent());
        }